

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

void __thiscall
FIX::ScreenLogFactory::ScreenLogFactory(ScreenLogFactory *this,SessionSettings *settings)

{
  pointer pcVar1;
  
  *(undefined **)this = &Message::typeinfo;
  *(undefined4 *)(this + 8) = 0x1000000;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(this + 0x18),
             &(settings->m_settings)._M_t._M_impl.super__Rb_tree_header);
  *(undefined ***)(this + 0x40) = &PTR__Dictionary_00152d40;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(this + 0x48),&(settings->m_defaults).m_data._M_t);
  *(ScreenLogFactory **)(this + 0x78) = this + 0x88;
  pcVar1 = (settings->m_defaults).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x78),pcVar1,pcVar1 + (settings->m_defaults).m_name._M_string_length)
  ;
  this[0x98] = (ScreenLogFactory)settings->m_resolveEnvVars;
  return;
}

Assistant:

explicit ScreenLogFactory(SessionSettings settings)
      : m_useSettings(true),
        m_settings(std::move(settings)) {}